

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

DecodeStatus DecodeR2RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint Op2;
  uint Op1;
  uint local_20;
  uint local_1c;
  
  DVar1 = Decode2OpInstruction(Insn,&local_20,&local_1c);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,local_1c,Address,Decoder);
    DecodeGRRegsRegisterClass(Inst,local_20,Address,Decoder);
    return MCDisassembler_Success;
  }
  DVar1 = Decode2OpInstructionFail(Inst,Insn,Address,Decoder);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeR2RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(Insn, &Op2, &Op1);
	if (S != MCDisassembler_Success)
		return Decode2OpInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);

	return S;
}